

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

int convert_YCoCg_to_RGB(uchar *orig,int width,int height,int channels)

{
  byte bVar1;
  uchar uVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  int y_1;
  uchar a;
  int cg_1;
  int co_1;
  int cg;
  int y;
  int co;
  int i;
  int channels_local;
  int height_local;
  int width_local;
  uchar *orig_local;
  
  if ((((width < 1) || (height < 1)) || (channels < 3)) ||
     ((4 < channels || (orig == (uchar *)0x0)))) {
    orig_local._4_4_ = -1;
  }
  else {
    if (channels == 3) {
      for (y = 0; SBORROW4(y,width * height * 3) != y + width * height * -3 < 0; y = y + 3) {
        bVar1 = orig[y];
        uVar4 = (uint)orig[y + 1];
        iVar5 = orig[y + 2] - 0x80;
        uVar2 = clamp_byte((uVar4 + (bVar1 - 0x80)) - iVar5);
        orig[y] = uVar2;
        uVar2 = clamp_byte(uVar4 + iVar5);
        orig[y + 1] = uVar2;
        uVar2 = clamp_byte((uVar4 - (bVar1 - 0x80)) - iVar5);
        orig[y + 2] = uVar2;
      }
    }
    else {
      for (y = 0; y < width * height * 4; y = y + 4) {
        bVar1 = orig[y];
        iVar5 = orig[y + 1] - 0x80;
        uVar2 = orig[y + 2];
        uVar4 = (uint)orig[y + 3];
        uVar3 = clamp_byte((uVar4 + (bVar1 - 0x80)) - iVar5);
        orig[y] = uVar3;
        uVar3 = clamp_byte(uVar4 + iVar5);
        orig[y + 1] = uVar3;
        uVar3 = clamp_byte((uVar4 - (bVar1 - 0x80)) - iVar5);
        orig[y + 2] = uVar3;
        orig[y + 3] = uVar2;
      }
    }
    orig_local._4_4_ = 0;
  }
  return orig_local._4_4_;
}

Assistant:

int
	convert_YCoCg_to_RGB
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	int i;
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 3) || (channels > 4) ||
		(orig == NULL) )
	{
		/*	nothing to do	*/
		return -1;
	}
	/*	do the conversion	*/
	if( channels == 3 )
	{
		for( i = 0; i < width*height*3; i += 3 )
		{
			int co = orig[i+0] - 128;
			int y  = orig[i+1];
			int cg = orig[i+2] - 128;
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
		}
	} else
	{
		for( i = 0; i < width*height*4; i += 4 )
		{
			int co = orig[i+0] - 128;
			int cg = orig[i+1] - 128;
			unsigned char a  = orig[i+2];
			int y  = orig[i+3];
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
			/*	A	*/
			orig[i+3] = a;
		}
	}
	/*	done	*/
	return 0;
}